

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexFloat_Test::TestBody(LexerTest_LexFloat_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  undefined1 local_e0 [8];
  Lexer lexer;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  __index_type local_48;
  internal local_40 [8];
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  buffer._M_str = "42";
  buffer._M_len = 2;
  wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer);
  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
  local_40[0] = (internal)!bVar1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
               (AssertionResult *)"lexer.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2e0,(char *)lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if ((undefined8 *)
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._64_8_ != &stack0xffffffffffffff90) {
      operator_delete((void *)lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                      local_70 + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
  }
  else {
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
    local_70 = 0x2a;
    local_68 = 0;
    local_48 = '\x03';
    testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
              (local_40,"*lexer","expected",(Token *)&lexer.index,
               (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                         super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2e2,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
    }
    if (gtest_ar_._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar_._0_8_);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)&stack0xffffffffffffff90);
  }
  if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index == '\x01') {
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._M_index = '\0';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)((long)&lexer.curr.
                                   super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                   .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                           + 8));
  }
  if (!bVar1) {
    buffer_00._M_str = "42.";
    buffer_00._M_len = 3;
    wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_00);
    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
    local_40[0] = (internal)!bVar1;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (bVar1) {
      testing::Message::Message((Message *)&local_28);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                 (AssertionResult *)"lexer.empty()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x2e6,(char *)lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if ((undefined8 *)
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._64_8_ != &stack0xffffffffffffff90) {
        operator_delete((void *)lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                        local_70 + 1);
      }
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
    }
    else {
      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
      local_68 = local_68 & 0xffffff00;
      local_60 = 0x4045000000000000;
      local_48 = '\x04';
      testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                (local_40,"*lexer","expected",(Token *)&lexer.index,
                 (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                           super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar_._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2e8,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if (local_28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)&stack0xffffffffffffff90);
    }
    if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index == '\x01') {
      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index = '\0';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)((long)&lexer.curr.
                                     super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                     .super__Optional_payload_base<wasm::WATParser::Token>.
                                     _M_payload + 8));
    }
    if (!bVar1) {
      buffer_01._M_str = "42.5";
      buffer_01._M_len = 4;
      wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_01);
      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
      local_40[0] = (internal)!bVar1;
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (bVar1) {
        testing::Message::Message((Message *)&local_28);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                   (AssertionResult *)"lexer.empty()","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x2ec,(char *)lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if ((undefined8 *)
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._64_8_ != &stack0xffffffffffffff90)
        {
          operator_delete((void *)lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                          local_70 + 1);
        }
        if (local_28._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_28._M_head_impl + 8))();
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
      }
      else {
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
        local_68 = local_68 & 0xffffff00;
        local_60 = 0x4045400000000000;
        local_48 = '\x04';
        testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                  (local_40,"*lexer","expected",(Token *)&lexer.index,
                   (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                             super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar_._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar_._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2ee,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          if (local_28._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_28._M_head_impl + 8))();
          }
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)&stack0xffffffffffffff90);
      }
      if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index == '\x01') {
        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)((long)&lexer.curr.
                                       super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                       _M_payload.
                                       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                       .super__Optional_payload_base<wasm::WATParser::Token>.
                                       _M_payload + 8));
      }
      if (!bVar1) {
        buffer_02._M_str = "42e0";
        buffer_02._M_len = 4;
        wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_02);
        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
        local_40[0] = (internal)!bVar1;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (bVar1) {
          testing::Message::Message((Message *)&local_28);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                     (AssertionResult *)"lexer.empty()","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x2f2,(char *)lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          if ((undefined8 *)
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
              &stack0xffffffffffffff90) {
            operator_delete((void *)lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                            local_70 + 1);
          }
          if (local_28._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_28._M_head_impl + 8))();
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
        }
        else {
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
          local_68 = local_68 & 0xffffff00;
          local_60 = 0x4045000000000000;
          local_48 = '\x04';
          testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                    (local_40,"*lexer","expected",(Token *)&lexer.index,
                     (Token *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                               super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
          if (local_40[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar_._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar_._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2f4,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
            if (local_28._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_28._M_head_impl + 8))();
            }
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               *)&stack0xffffffffffffff90);
        }
        if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._M_index == '\x01') {
          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index = '\0';
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               *)((long)&lexer.curr.
                                         super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                         _M_payload.
                                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                         .super__Optional_payload_base<wasm::WATParser::Token>.
                                         _M_payload + 8));
        }
        if (!bVar1) {
          buffer_03._M_str = "42.e1";
          buffer_03._M_len = 5;
          wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_03);
          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
          local_40[0] = (internal)!bVar1;
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
          if (bVar1) {
            testing::Message::Message((Message *)&local_28);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)
                       &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                       (AssertionResult *)"lexer.empty()","true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x2f8,(char *)lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
            if ((undefined8 *)
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                &stack0xffffffffffffff90) {
              operator_delete((void *)lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_,
                              local_70 + 1);
            }
            if (local_28._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_28._M_head_impl + 8))();
            }
            if (gtest_ar_._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_._0_8_);
            }
          }
          else {
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
            local_68 = local_68 & 0xffffff00;
            local_60 = 0x407a400000000000;
            local_48 = '\x04';
            testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                      (local_40,"*lexer","expected",(Token *)&lexer.index,
                       (Token *)&lexer.curr.
                                 super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                 .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged);
            if (local_40[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_28);
              if (gtest_ar_._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar_._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2fa,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
              if (local_28._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_28._M_head_impl + 8))();
              }
            }
            if (gtest_ar_._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_._0_8_);
            }
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 *)&stack0xffffffffffffff90);
          }
          if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._M_index == '\x01') {
            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._M_index = '\0';
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                 *)((long)&lexer.curr.
                                           super__Optional_base<wasm::WATParser::Token,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                           .super__Optional_payload_base<wasm::WATParser::Token>.
                                           _M_payload + 8));
          }
          if (!bVar1) {
            buffer_04._M_str = "42E1";
            buffer_04._M_len = 4;
            wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_04);
            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
            local_40[0] = (internal)!bVar1;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            if (bVar1) {
              testing::Message::Message((Message *)&local_28);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40,
                         (AssertionResult *)"lexer.empty()","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                         ,0x2fe,(char *)lexer.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                        );
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
              if ((undefined8 *)
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                  &stack0xffffffffffffff90) {
                operator_delete((void *)lexer.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                ,local_70 + 1);
              }
              if (local_28._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_28._M_head_impl + 8))();
              }
              if (gtest_ar_._0_8_ != 0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&gtest_ar_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             gtest_ar_._0_8_);
              }
            }
            else {
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
              local_68 = local_68 & 0xffffff00;
              local_60 = 0x407a400000000000;
              local_48 = '\x04';
              testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                        (local_40,"*lexer","expected",(Token *)&lexer.index,
                         (Token *)&lexer.curr.
                                   super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                   .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged)
              ;
              if (local_40[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar_._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar_._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x300,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
                if (local_28._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                }
              }
              if (gtest_ar_._0_8_ != 0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&gtest_ar_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             gtest_ar_._0_8_);
              }
              std::__detail::__variant::
              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   *)&stack0xffffffffffffff90);
            }
            if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._M_index == '\x01') {
              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              .
              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ._M_index = '\0';
              std::__detail::__variant::
              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
              ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                   *)((long)&lexer.curr.
                                             super__Optional_base<wasm::WATParser::Token,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                             .super__Optional_payload_base<wasm::WATParser::Token>.
                                             _M_payload + 8));
            }
            if (!bVar1) {
              buffer_05._M_str = "42e+2";
              buffer_05._M_len = 5;
              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_05);
              bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
              local_40[0] = (internal)!bVar1;
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              if (bVar1) {
                testing::Message::Message((Message *)&local_28);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)
                           &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,local_40
                           ,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                           ,0x304,(char *)lexer.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _64_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
                if ((undefined8 *)
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                    &stack0xffffffffffffff90) {
                  operator_delete((void *)lexer.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _64_8_,local_70 + 1);
                }
                if (local_28._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                }
                if (gtest_ar_._0_8_ != 0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&gtest_ar_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               gtest_ar_._0_8_);
                }
              }
              else {
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                local_68 = local_68 & 0xffffff00;
                local_60 = 0x40b0680000000000;
                local_48 = '\x04';
                testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                          (local_40,"*lexer","expected",(Token *)&lexer.index,
                           (Token *)&lexer.curr.
                                     super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                     .super__Optional_payload_base<wasm::WATParser::Token>.
                                     _M_engaged);
                if (local_40[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_28);
                  if (gtest_ar_._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar_._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x306,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if (local_28._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                  }
                }
                if (gtest_ar_._0_8_ != 0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&gtest_ar_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               gtest_ar_._0_8_);
                }
                std::__detail::__variant::
                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     *)&stack0xffffffffffffff90);
              }
              if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._M_index == '\x01') {
                lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._M_index = '\0';
                std::__detail::__variant::
                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                     *)((long)&lexer.curr.
                                               super__Optional_base<wasm::WATParser::Token,_false,_false>
                                               ._M_payload.
                                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                               .super__Optional_payload_base<wasm::WATParser::Token>
                                               ._M_payload + 8));
              }
              if (!bVar1) {
                buffer_06._M_str = "42.E-02";
                buffer_06._M_len = 7;
                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_06);
                bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                local_40[0] = (internal)!bVar1;
                gtest_ar_.success_ = false;
                gtest_ar_._1_7_ = 0;
                if (bVar1) {
                  testing::Message::Message((Message *)&local_28);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)
                             &lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                             local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                             ,0x30a,(char *)lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _64_8_);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_);
                  if ((undefined8 *)
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                      &stack0xffffffffffffff90) {
                    operator_delete((void *)lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _64_8_,local_70 + 1);
                  }
                  if (local_28._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                  }
                  if (gtest_ar_._0_8_ != 0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&gtest_ar_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)gtest_ar_._0_8_);
                  }
                }
                else {
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                  local_68 = local_68 & 0xffffff00;
                  local_60 = 0x3fdae147ae147ae1;
                  local_48 = '\x04';
                  testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                            (local_40,"*lexer","expected",(Token *)&lexer.index,
                             (Token *)&lexer.curr.
                                       super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                       _M_payload.
                                       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                       .super__Optional_payload_base<wasm::WATParser::Token>.
                                       _M_engaged);
                  if (local_40[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_28);
                    if (gtest_ar_._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar_._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x30c,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_);
                    if (local_28._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_28._M_head_impl + 8))();
                    }
                  }
                  if (gtest_ar_._0_8_ != 0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&gtest_ar_,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)gtest_ar_._0_8_);
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       *)&stack0xffffffffffffff90);
                }
                if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._M_index == '\x01') {
                  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                  super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  .
                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ._M_index = '\0';
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                       *)((long)&lexer.curr.
                                                 super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                 ._M_payload.
                                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                 .
                                                 super__Optional_payload_base<wasm::WATParser::Token>
                                                 ._M_payload + 8));
                }
                if (!bVar1) {
                  buffer_07._M_str = "42.0e0";
                  buffer_07._M_len = 6;
                  wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_07);
                  bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                  local_40[0] = (internal)!bVar1;
                  gtest_ar_.success_ = false;
                  gtest_ar_._1_7_ = 0;
                  if (bVar1) {
                    testing::Message::Message((Message *)&local_28);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)
                               &lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                               local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                               ,0x310,(char *)lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _64_8_);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_);
                    if ((undefined8 *)
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                        &stack0xffffffffffffff90) {
                      operator_delete((void *)lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _64_8_,local_70 + 1);
                    }
                    if (local_28._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_28._M_head_impl + 8))();
                    }
                    if (gtest_ar_._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar_._0_8_);
                    }
                  }
                  else {
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                    local_68 = local_68 & 0xffffff00;
                    local_60 = 0x4045000000000000;
                    local_48 = '\x04';
                    testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                              (local_40,"*lexer","expected",(Token *)&lexer.index,
                               (Token *)&lexer.curr.
                                         super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                         _M_payload.
                                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                         .super__Optional_payload_base<wasm::WATParser::Token>.
                                         _M_engaged);
                    if (local_40[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_28);
                      if (gtest_ar_._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar_._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x312,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_);
                      if (local_28._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_28._M_head_impl + 8))();
                      }
                    }
                    if (gtest_ar_._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar_._0_8_);
                    }
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         *)&stack0xffffffffffffff90);
                  }
                  if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data
                      .
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._M_index == '\x01') {
                    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
                    .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    .
                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ._M_index = '\0';
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                         *)((long)&lexer.curr.
                                                                                                      
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                  }
                  if (!bVar1) {
                    buffer_08._M_str = "42.0E1";
                    buffer_08._M_len = 6;
                    wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_08);
                    bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                    local_40[0] = (internal)!bVar1;
                    gtest_ar_.success_ = false;
                    gtest_ar_._1_7_ = 0;
                    if (bVar1) {
                      testing::Message::Message((Message *)&local_28);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)
                                 &lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                                 local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                 ,0x316,(char *)lexer.curr.
                                                super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<wasm::WATParser::Token>
                                                ._64_8_);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_);
                      if ((undefined8 *)
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                          &stack0xffffffffffffff90) {
                        operator_delete((void *)lexer.curr.
                                                super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<wasm::WATParser::Token>
                                                ._64_8_,local_70 + 1);
                      }
                      if (local_28._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_28._M_head_impl + 8))();
                      }
                      if (gtest_ar_._0_8_ != 0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&gtest_ar_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)gtest_ar_._0_8_);
                      }
                    }
                    else {
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                      local_68 = local_68 & 0xffffff00;
                      local_60 = 0x407a400000000000;
                      local_48 = '\x04';
                      testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                (local_40,"*lexer","expected",(Token *)&lexer.index,
                                 (Token *)&lexer.curr.
                                           super__Optional_base<wasm::WATParser::Token,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                           .super__Optional_payload_base<wasm::WATParser::Token>.
                                           _M_engaged);
                      if (local_40[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_28);
                        if (gtest_ar_._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar_._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x318,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        if (local_28._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_28._M_head_impl + 8))();
                        }
                      }
                      if (gtest_ar_._0_8_ != 0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&gtest_ar_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)gtest_ar_._0_8_);
                      }
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           *)&stack0xffffffffffffff90);
                    }
                    if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                        data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._M_index == '\x01') {
                      lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                      _M_payload.super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                      .super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data
                      .
                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      .
                      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ._M_index = '\0';
                      std::__detail::__variant::
                      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                           *)((long)&lexer.curr.
                                                                                                          
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                    }
                    if (!bVar1) {
                      buffer_09._M_str = "42.0e+2";
                      buffer_09._M_len = 7;
                      wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_09);
                      bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                      local_40[0] = (internal)!bVar1;
                      gtest_ar_.success_ = false;
                      gtest_ar_._1_7_ = 0;
                      if (bVar1) {
                        testing::Message::Message((Message *)&local_28);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)
                                   &lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_engaged
                                   ,local_40,(AssertionResult *)"lexer.empty()","true","false",in_R9
                                  );
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                   ,0x31c,(char *)lexer.curr.
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_);
                        if ((undefined8 *)
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                            &stack0xffffffffffffff90) {
                          operator_delete((void *)lexer.curr.
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                        }
                        if (local_28._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_28._M_head_impl + 8))();
                        }
                        if (gtest_ar_._0_8_ != 0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&gtest_ar_,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)gtest_ar_._0_8_);
                        }
                      }
                      else {
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                        local_68 = local_68 & 0xffffff00;
                        local_60 = 0x40b0680000000000;
                        local_48 = '\x04';
                        testing::internal::
                        CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                  (local_40,"*lexer","expected",(Token *)&lexer.index,
                                   (Token *)&lexer.curr.
                                             super__Optional_base<wasm::WATParser::Token,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                             .super__Optional_payload_base<wasm::WATParser::Token>.
                                             _M_engaged);
                        if (local_40[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_28);
                          if (gtest_ar_._0_8_ == 0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = *(char **)gtest_ar_._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x31e,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_);
                          if (local_28._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_28._M_head_impl + 8))();
                          }
                        }
                        if (gtest_ar_._0_8_ != 0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&gtest_ar_,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)gtest_ar_._0_8_);
                        }
                        std::__detail::__variant::
                        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             *)&stack0xffffffffffffff90);
                      }
                      if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                          data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._M_index == '\x01') {
                        lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                        _M_payload.
                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                        super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                        data.
                        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        .
                        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ._M_index = '\0';
                        std::__detail::__variant::
                        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                             *)((long)&lexer.curr.
                                                                                                              
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                      }
                      if (!bVar1) {
                        buffer_10._M_str = "42.0E-2";
                        buffer_10._M_len = 7;
                        wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_10);
                        bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                        local_40[0] = (internal)!bVar1;
                        gtest_ar_.success_ = false;
                        gtest_ar_._1_7_ = 0;
                        if (bVar1) {
                          testing::Message::Message((Message *)&local_28);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)
                                     &lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>.
                                      _M_engaged,local_40,(AssertionResult *)"lexer.empty()","true",
                                     "false",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                     ,0x322,(char *)lexer.curr.
                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_);
                          if ((undefined8 *)
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                              &stack0xffffffffffffff90) {
                            operator_delete((void *)lexer.curr.
                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                          }
                          if (local_28._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_28._M_head_impl + 8))();
                          }
                          if (gtest_ar_._0_8_ != 0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&gtest_ar_,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)gtest_ar_._0_8_);
                          }
                        }
                        else {
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                          local_68 = local_68 & 0xffffff00;
                          local_60 = 0x3fdae147ae147ae1;
                          local_48 = '\x04';
                          testing::internal::
                          CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                    (local_40,"*lexer","expected",(Token *)&lexer.index,
                                     (Token *)&lexer.curr.
                                               super__Optional_base<wasm::WATParser::Token,_false,_false>
                                               ._M_payload.
                                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                               .super__Optional_payload_base<wasm::WATParser::Token>
                                               ._M_engaged);
                          if (local_40[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_28);
                            if (gtest_ar_._0_8_ == 0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = *(char **)gtest_ar_._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x324,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if (local_28._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_28._M_head_impl + 8))();
                            }
                          }
                          if (gtest_ar_._0_8_ != 0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&gtest_ar_,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)gtest_ar_._0_8_);
                          }
                          std::__detail::__variant::
                          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               *)&stack0xffffffffffffff90);
                        }
                        if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value
                            .data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._M_index == '\x01') {
                          lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                          _M_payload.
                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.
                          data.
                          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          .
                          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ._M_index = '\0';
                          std::__detail::__variant::
                          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                               *)((long)&lexer.curr.
                                                                                                                  
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                        }
                        if (!bVar1) {
                          buffer_11._M_str = "+42.0e+2";
                          buffer_11._M_len = 8;
                          wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_11);
                          bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                          local_40[0] = (internal)!bVar1;
                          gtest_ar_.success_ = false;
                          gtest_ar_._1_7_ = 0;
                          if (bVar1) {
                            testing::Message::Message((Message *)&local_28);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)
                                       &lexer.curr.
                                        super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                        .super__Optional_payload_base<wasm::WATParser::Token>.
                                        _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                       "true","false",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                       ,0x328,(char *)lexer.curr.
                                                                                                            
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_);
                            if ((undefined8 *)
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                &stack0xffffffffffffff90) {
                              operator_delete((void *)lexer.curr.
                                                                                                            
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                            }
                            if (local_28._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_28._M_head_impl + 8))();
                            }
                            if (gtest_ar_._0_8_ != 0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&gtest_ar_,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)gtest_ar_._0_8_);
                            }
                          }
                          else {
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true;
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                            local_68 = local_68 & 0xffffff00;
                            local_60 = 0x40b0680000000000;
                            local_48 = '\x04';
                            testing::internal::
                            CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                      (local_40,"*lexer","expected",(Token *)&lexer.index,
                                       (Token *)&lexer.curr.
                                                 super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                 ._M_payload.
                                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                 .
                                                 super__Optional_payload_base<wasm::WATParser::Token>
                                                 ._M_engaged);
                            if (local_40[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_28);
                              if (gtest_ar_._0_8_ == 0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = *(char **)gtest_ar_._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x32a,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_);
                              if (local_28._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_28._M_head_impl + 8))();
                              }
                            }
                            if (gtest_ar_._0_8_ != 0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&gtest_ar_,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)gtest_ar_._0_8_);
                            }
                            std::__detail::__variant::
                            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 *)&stack0xffffffffffffff90);
                          }
                          if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                              _M_value.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._M_index == '\x01') {
                            lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value
                            .data.
                            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            .
                            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ._M_index = '\0';
                            std::__detail::__variant::
                            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                            ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                 *)((long)&lexer.curr.
                                                                                                                      
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                          }
                          if (!bVar1) {
                            buffer_12._M_str = "-42.0e+2";
                            buffer_12._M_len = 8;
                            wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_12);
                            bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                            local_40[0] = (internal)!bVar1;
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            if (bVar1) {
                              testing::Message::Message((Message *)&local_28);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)
                                         &lexer.curr.
                                          super__Optional_base<wasm::WATParser::Token,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                          .super__Optional_payload_base<wasm::WATParser::Token>.
                                          _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                         "true","false",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                         ,0x32e,(char *)lexer.curr.
                                                                                                                
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_);
                              if ((undefined8 *)
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                  &stack0xffffffffffffff90) {
                                operator_delete((void *)lexer.curr.
                                                                                                                
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                              }
                              if (local_28._M_head_impl !=
                                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                (**(code **)(*(long *)local_28._M_head_impl + 8))();
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                            }
                            else {
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = true
                              ;
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                              local_68 = local_68 & 0xffffff00;
                              local_60 = 0xc0b0680000000000;
                              local_48 = '\x04';
                              testing::internal::
                              CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                        (local_40,"*lexer","expected",(Token *)&lexer.index,
                                         (Token *)&lexer.curr.
                                                                                                      
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_engaged);
                              if (local_40[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_28);
                                if (gtest_ar_._0_8_ == 0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = *(char **)gtest_ar_._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x330,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                              }
                              if (gtest_ar_._0_8_ != 0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&gtest_ar_,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)gtest_ar_._0_8_);
                              }
                              std::__detail::__variant::
                              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)&stack0xffffffffffffff90);
                            }
                            if (lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index == '\x01') {
                              lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                              _M_payload.
                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                              super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                              _M_value.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ._M_index = '\0';
                              std::__detail::__variant::
                              _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                            }
                            if (!bVar1) {
                              buffer_13._M_str = "4_2.0_0e+0_2";
                              buffer_13._M_len = 0xc;
                              wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_13);
                              bVar1 = wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                              local_40[0] = (internal)!bVar1;
                              gtest_ar_.success_ = false;
                              gtest_ar_._1_7_ = 0;
                              if (bVar1) {
                                testing::Message::Message((Message *)&local_28);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)
                                           &lexer.curr.
                                            super__Optional_base<wasm::WATParser::Token,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                            .super__Optional_payload_base<wasm::WATParser::Token>.
                                            _M_engaged,local_40,(AssertionResult *)"lexer.empty()",
                                           "true","false",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                           ,0x334,(char *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_28)
                                ;
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_);
                                if ((undefined8 *)
                                    lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._64_8_ !=
                                    &stack0xffffffffffffff90) {
                                  operator_delete((void *)lexer.curr.
                                                                                                                    
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                }
                                if (local_28._M_head_impl !=
                                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                              }
                              else {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged =
                                     true;
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
                                local_68 = local_68 & 0xffffff00;
                                local_60 = 0x40b0680000000000;
                                local_48 = '\x04';
                                testing::internal::
                                CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                                          (local_40,"*lexer","expected",(Token *)&lexer.index,
                                           (Token *)&lexer.curr.
                                                                                                          
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_engaged);
                                if (local_40[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_28);
                                  if (gtest_ar_._0_8_ == 0) {
                                    pcVar2 = "";
                                  }
                                  else {
                                    pcVar2 = *(char **)gtest_ar_._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x336,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)&stack0xffffffffffffff90);
                              }
                              if (lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index == '\x01') {
                                lexer.curr.
                                super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                _M_payload.
                                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                                super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                _M_value.data.
                                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                .
                                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ._M_index = '\0';
                                std::__detail::__variant::
                                _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                              }
                              if (!bVar1) {
                                buffer_14._M_str = "+junk";
                                buffer_14._M_len = 5;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_14);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x33a,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_15._M_str = "42junk";
                                buffer_15._M_len = 6;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_15);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x33e,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_16._M_str = "42.junk";
                                buffer_16._M_len = 7;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_16);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x342,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_17._M_str = "42.0junk";
                                buffer_17._M_len = 8;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_17);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x346,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_18._M_str = "42.Ejunk";
                                buffer_18._M_len = 8;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_18);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x34a,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_19._M_str = "42.e-junk";
                                buffer_19._M_len = 9;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_19);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x34e,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_20._M_str = "42.e-10junk";
                                buffer_20._M_len = 0xb;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_20);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x352,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_21._M_str = "+";
                                buffer_21._M_len = 1;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_21);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x356,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_22._M_str = "42e";
                                buffer_22._M_len = 3;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_22);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x35a,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_23._M_str = "42eABC";
                                buffer_23._M_len = 6;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_23);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x35e,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_24._M_str = "42e0xABC";
                                buffer_24._M_len = 8;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_24);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x362,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_25._M_str = "+-42";
                                buffer_25._M_len = 4;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_25);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x366,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_26._M_str = "-+42";
                                buffer_26._M_len = 4;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_26);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x36a,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_27._M_str = "42e+-0";
                                buffer_27._M_len = 6;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_27);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x36e,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_28._M_str = "42e-+0";
                                buffer_28._M_len = 6;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_28);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x372,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_29._M_str = "42p0";
                                buffer_29._M_len = 4;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_29);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x376,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                                buffer_30._M_str = "42P0";
                                buffer_30._M_len = 4;
                                wasm::WATParser::Lexer::Lexer((Lexer *)local_e0,buffer_30);
                                local_40[0] = (internal)
                                              wasm::WATParser::Lexer::empty((Lexer *)local_e0);
                                gtest_ar_.success_ = false;
                                gtest_ar_._1_7_ = 0;
                                if (!(bool)local_40[0]) {
                                  testing::Message::Message((Message *)&local_28);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)
                                             &lexer.curr.
                                              super__Optional_base<wasm::WATParser::Token,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                              .super__Optional_payload_base<wasm::WATParser::Token>.
                                              _M_engaged,local_40,(AssertionResult *)"lexer.empty()"
                                             ,"false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                                             ,0x37a,(char *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_28);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_);
                                  if ((undefined8 *)
                                      lexer.curr.
                                      super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                      .super__Optional_payload_base<wasm::WATParser::Token>._64_8_
                                      != &stack0xffffffffffffff90) {
                                    operator_delete((void *)lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._64_8_,local_70 + 1);
                                  }
                                  if (local_28._M_head_impl !=
                                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    (**(code **)(*(long *)local_28._M_head_impl + 8))();
                                  }
                                }
                                if (gtest_ar_._0_8_ != 0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&gtest_ar_,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)gtest_ar_._0_8_);
                                }
                                if (lexer.curr.
                                    super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                    .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                                    ._M_value.data.
                                    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                    ._M_index == '\x01') {
                                  lexer.curr.
                                  super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                  _M_payload.
                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                  .super__Optional_payload_base<wasm::WATParser::Token>._M_payload.
                                  _M_value.data.
                                  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ._M_index = '\0';
                                  std::__detail::__variant::
                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                  ::~_Variant_storage((
                                                  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                                  *)((long)&lexer.curr.
                                                                                                                        
                                                  super__Optional_base<wasm::WATParser::Token,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<wasm::WATParser::Token>
                                                  ._M_payload + 8));
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(LexerTest, LexFloat) {
  {
    Lexer lexer("42"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42"sv, IntTok{42, NoSign}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42."sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42."sv, FloatTok{{}, 42.}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.5"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.5"sv, FloatTok{{}, 42.5}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42e0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42e0"sv, FloatTok{{}, 42e0}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.e1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.e1"sv, FloatTok{{}, 42.e1}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42E1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42E1"sv, FloatTok{{}, 42E1}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42e+2"sv, FloatTok{{}, 42e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.E-02"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.E-02"sv, FloatTok{{}, 42.E-02}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0e0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0e0"sv, FloatTok{{}, 42.0e0}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0E1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0E1"sv, FloatTok{{}, 42.0E1}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0e+2"sv, FloatTok{{}, 42.0e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("42.0E-2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"42.0E-2"sv, FloatTok{{}, 42.0E-2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+42.0e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+42.0e+2"sv, FloatTok{{}, +42.0e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-42.0e+2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-42.0e+2"sv, FloatTok{{}, -42.0e+2}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("4_2.0_0e+0_2"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"4_2.0_0e+0_2"sv, FloatTok{{}, 42.00e+02}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.0junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.Ejunk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.e-junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42.e-10junk"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("+"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42eABC"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e0xABC"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("+-42"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("-+42"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e+-0"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42e-+0"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42p0"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("42P0"sv);
    EXPECT_TRUE(lexer.empty());
  }
}